

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.cc
# Opt level: O3

int __thiscall re2::RE2::Set::Add(Set *this,StringPiece *pattern,string *error)

{
  pointer *pppRVar1;
  ushort uVar2;
  iterator __position;
  ParseFlags global_flags;
  Regexp *pRVar3;
  Regexp *pRVar4;
  Regexp **sub_00;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  ostream *poVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  RegexpStatus status;
  Regexp *sub [2];
  Regexp *local_210;
  ulong local_208;
  Regexp *local_200;
  string local_1f8;
  RegexpStatus local_1d8;
  undefined1 local_1b8 [16];
  Regexp local_1a8 [9];
  
  if (this->compiled_ == true) {
    LogMessage::LogMessage
              ((LogMessage *)local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/set.cc",0x1e,3)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 8),"RE2::Set::Add after Compile",0x1b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b8);
    iVar7 = -1;
  }
  else {
    global_flags = Options::ParseFlags(&this->options_);
    local_1d8.code_ = kRegexpSuccess;
    local_1d8.error_arg_.ptr_ = (char *)0x0;
    local_1d8.error_arg_.length_ = 0;
    local_1d8.tmp_ = (string *)0x0;
    pRVar3 = Regexp::Parse(pattern,global_flags,&local_1d8);
    if (pRVar3 == (Regexp *)0x0) {
      if (error != (string *)0x0) {
        RegexpStatus::Text_abi_cxx11_((string *)local_1b8,&local_1d8);
        std::__cxx11::string::operator=((string *)error,(string *)local_1b8);
        if ((Regexp *)local_1b8._0_8_ != local_1a8) {
          operator_delete((void *)local_1b8._0_8_);
        }
      }
      iVar7 = -1;
      if ((this->options_).log_errors_ == true) {
        LogMessage::LogMessage
                  ((LogMessage *)local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/set.cc",
                   0x2b,2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 8),"Error parsing \'",0xf);
        poVar6 = operator<<((ostream *)(local_1b8 + 8),pattern);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\': ",3);
        RegexpStatus::Text_abi_cxx11_(&local_1f8,&local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
        LogMessage::~LogMessage((LogMessage *)local_1b8);
      }
    }
    else {
      uVar8 = (ulong)((long)(this->re_).
                            super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->re_).
                           super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3;
      pRVar4 = Regexp::HaveMatch((int)uVar8,global_flags);
      if (pRVar3->op_ == '\x05') {
        uVar2 = pRVar3->nsub_;
        uVar9 = (ulong)uVar2;
        local_208 = uVar8;
        local_200 = pRVar4;
        sub_00 = (Regexp **)operator_new__((ulong)((uint)uVar2 * 8 + 8));
        if (uVar9 != 0) {
          uVar8 = 0;
          do {
            paVar5 = &pRVar3->field_5;
            if (1 < pRVar3->nsub_) {
              paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar3->field_5).submany_;
            }
            pRVar4 = Regexp::Incref(paVar5[uVar8].subone_);
            sub_00[uVar8] = pRVar4;
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
        sub_00[uVar9] = local_200;
        Regexp::Decref(pRVar3);
        pRVar3 = Regexp::Concat(sub_00,uVar2 + 1,global_flags);
        local_210 = pRVar3;
        operator_delete__(sub_00);
        uVar8 = local_208;
      }
      else {
        local_1b8._0_8_ = pRVar3;
        local_1b8._8_8_ = pRVar4;
        pRVar3 = Regexp::Concat((Regexp **)local_1b8,2,global_flags);
        local_210 = pRVar3;
      }
      iVar7 = (int)uVar8;
      __position._M_current =
           (this->re_).super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->re_).super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<re2::Regexp*,std::allocator<re2::Regexp*>>::
        _M_realloc_insert<re2::Regexp*const&>
                  ((vector<re2::Regexp*,std::allocator<re2::Regexp*>> *)&this->re_,__position,
                   &local_210);
      }
      else {
        *__position._M_current = pRVar3;
        pppRVar1 = &(this->re_).super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppRVar1 = *pppRVar1 + 1;
      }
    }
    RegexpStatus::~RegexpStatus(&local_1d8);
  }
  return iVar7;
}

Assistant:

int RE2::Set::Add(const StringPiece& pattern, string* error) {
  if (compiled_) {
    LOG(DFATAL) << "RE2::Set::Add after Compile";
    return -1;
  }

  Regexp::ParseFlags pf = static_cast<Regexp::ParseFlags>(
    options_.ParseFlags());

  RegexpStatus status;
  re2::Regexp* re = Regexp::Parse(pattern, pf, &status);
  if (re == NULL) {
    if (error != NULL)
      *error = status.Text();
    if (options_.log_errors())
      LOG(ERROR) << "Error parsing '" << pattern << "': " << status.Text();
    return -1;
  }

  // Concatenate with match index and push on vector.
  int n = static_cast<int>(re_.size());
  re2::Regexp* m = re2::Regexp::HaveMatch(n, pf);
  if (re->op() == kRegexpConcat) {
    int nsub = re->nsub();
    re2::Regexp** sub = new re2::Regexp*[nsub + 1];
    for (int i = 0; i < nsub; i++)
      sub[i] = re->sub()[i]->Incref();
    sub[nsub] = m;
    re->Decref();
    re = re2::Regexp::Concat(sub, nsub + 1, pf);
    delete[] sub;
  } else {
    re2::Regexp* sub[2];
    sub[0] = re;
    sub[1] = m;
    re = re2::Regexp::Concat(sub, 2, pf);
  }
  re_.push_back(re);
  return n;
}